

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL> *
__thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>
::Iterator::Current(Iterator *this)

{
  array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>
  *paVar1;
  _func_void_void_ptr_int_unsigned_short_ptr_int_int_int_int_int_int_int_int *p_Var2;
  _func_void_void_ptr_int_unsigned_short_ptr_int_int_int_int_int_int_int_int *p_Var3;
  _func_void_void_ptr_int_unsigned_short_ptr_int_int_int_int_int_int_int_int *p_Var4;
  array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>
  *paVar5;
  
  if ((this->value_)._M_t.
      super___uniq_ptr_impl<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::default_delete<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_*,_std::default_delete<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>
      .
      super__Head_base<0UL,_const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_*,_false>
      ._M_head_impl ==
      (array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>
       *)0x0) {
    paVar5 = (array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>
              *)operator_new(0x20);
    paVar1 = (this->iterator_)._M_current;
    p_Var2 = paVar1->_M_elems[1];
    p_Var3 = paVar1->_M_elems[2];
    p_Var4 = paVar1->_M_elems[3];
    paVar5->_M_elems[0] = paVar1->_M_elems[0];
    paVar5->_M_elems[1] = p_Var2;
    paVar5->_M_elems[2] = p_Var3;
    paVar5->_M_elems[3] = p_Var4;
    (this->value_)._M_t.
    super___uniq_ptr_impl<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::default_delete<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_*,_std::default_delete<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>
    .
    super__Head_base<0UL,_const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_*,_false>
    ._M_head_impl = paVar5;
  }
  return (this->value_)._M_t.
         super___uniq_ptr_impl<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>,_std::default_delete<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_*,_std::default_delete<const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_>_>
         .
         super__Head_base<0UL,_const_std::array<void_(*)(void_*,_int,_const_unsigned_short_*,_int,_int,_int,_int,_int,_int,_int,_int),_4UL>_*,_false>
         ._M_head_impl;
}

Assistant:

const T* Current() const override {
      if (value_.get() == nullptr) value_.reset(new T(*iterator_));
      return value_.get();
    }